

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

CBlockUndo * GetUndoChecked(BlockManager *blockman,CBlockIndex *blockindex)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pAVar3;
  undefined8 uVar4;
  BlockManager *in_RDX;
  CBlockUndo *in_RDI;
  long in_FS_OFFSET;
  CBlockUndo *blockUndo;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff58;
  CBlockUndo *pszName;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  uint3 in_stack_ffffffffffffffa4;
  uint uVar5;
  CBlockIndex *in_stack_ffffffffffffffd8;
  CBlockUndo *in_stack_ffffffffffffffe0;
  BlockManager *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffffa4;
  pszName = in_RDI;
  CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_ffffffffffffff58);
  if (*(int *)((long)&(in_RDX->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base.
                      _M_mutex + 0x18) != 0) {
    pAVar3 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)pszName,
               (char *)in_RDI,(int)((ulong)pAVar3 >> 0x20),SUB81((ulong)pAVar3 >> 0x18,0));
    CheckBlockDataAvailability
              (in_RDX,(CBlockIndex *)CONCAT44(uVar5,in_stack_ffffffffffffffa0),
               (bool)in_stack_ffffffffffffff9f);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
    bVar2 = node::BlockManager::UndoReadFromDisk
                      (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
                      );
    if (!bVar2) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                 (char *)CONCAT44(uVar5,in_stack_ffffffffffffffa0),
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      JSONRPCError((int)((ulong)in_RDX >> 0x20),
                   (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_012a8dce;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pszName;
  }
LAB_012a8dce:
  __stack_chk_fail();
}

Assistant:

static CBlockUndo GetUndoChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlockUndo blockUndo;

    // The Genesis block does not have undo data
    if (blockindex.nHeight == 0) return blockUndo;

    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/true);
    }

    if (!blockman.UndoReadFromDisk(blockUndo, blockindex)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Can't read undo data from disk");
    }

    return blockUndo;
}